

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

size_t anon_unknown.dwarf_e925f::parseThreadMap(string *filename)

{
  bool bVar1;
  reference pcVar2;
  size_t bitmap;
  string hexChar;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string threadMap;
  size_t threads;
  string *in_stack_000001a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *local_a0;
  allocator<char> local_82;
  char local_81;
  char *local_80;
  undefined8 local_78;
  string local_70 [39];
  char local_49;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string *local_38;
  string local_30 [32];
  size_t local_10;
  
  local_10 = 0;
  getString(in_stack_000001a8);
  local_38 = local_30;
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48 = std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    local_49 = *pcVar2;
    if (local_49 != ',') {
      local_80 = &local_81;
      local_78 = 1;
      local_81 = local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,local_80,local_78,&local_82);
      std::allocator<char>::~allocator(&local_82);
      in_stack_ffffffffffffff50 =
           (string *)
           std::__cxx11::stoul(in_stack_ffffffffffffff50,(size_t *)in_stack_ffffffffffffff48,0);
      for (local_a0 = in_stack_ffffffffffffff50; local_a0 != (string *)0x0;
          local_a0 = (string *)((ulong)((long)&local_a0[-1].field_2 + 0xfU) & (ulong)local_a0)) {
        local_10 = local_10 + 1;
      }
      std::__cxx11::string::~string(local_70);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40);
  }
  std::__cxx11::string::~string(local_30);
  return local_10;
}

Assistant:

size_t parseThreadMap(const string& filename)
{
  size_t threads = 0;
  string threadMap = getString(filename);

  for (char c : threadMap)
  {
    if (c != ',')
    {
      string hexChar { c };
      size_t bitmap = stoul(hexChar, nullptr, 16);
      for (; bitmap > 0; threads++)
        bitmap &= bitmap - 1;
    }
  }

  return threads;
}